

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForField
          (FileGenerator *this,FieldDescriptor *field,CrossFileReferences *refs)

{
  bool bVar1;
  Descriptor *local_28;
  Descriptor *msg;
  CrossFileReferences *refs_local;
  FieldDescriptor *field_local;
  FileGenerator *this_local;
  
  msg = (Descriptor *)refs;
  refs_local = (CrossFileReferences *)field;
  field_local = (FieldDescriptor *)this;
  local_28 = FieldDescriptor::message_type(field);
  if ((local_28 != (Descriptor *)0x0) &&
     ((bVar1 = IsImplicitWeakField((FieldDescriptor *)refs_local,&this->options_,
                                   &this->scc_analyzer_), bVar1 ||
      (bVar1 = IsWeak((FieldDescriptor *)refs_local,&this->options_), bVar1)))) {
    std::
    unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::insert((unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)msg,&local_28);
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForField(const FieldDescriptor* field,
                                                   CrossFileReferences* refs) {
  const Descriptor* msg = field->message_type();
  if (msg == nullptr) return;

  if (IsImplicitWeakField(field, options_, &scc_analyzer_) ||
      IsWeak(field, options_)) {
    refs->weak_default_instances.insert(msg);
  }
}